

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O1

void __thiscall Field::Field(Field *this,int from,int to,string *str)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  uint32_t uVar4;
  size_type sVar5;
  
  this->from = from;
  this->to = to;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->value = 0;
  this->match = true;
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    uVar4 = this->value;
    sVar5 = 0;
    do {
      cVar1 = pcVar3[sVar5];
      if (cVar1 == '0') {
        uVar4 = uVar4 * 2;
LAB_00102b23:
        this->value = uVar4;
      }
      else {
        if (cVar1 == '1') {
          uVar4 = uVar4 * 2 + 1;
          goto LAB_00102b23;
        }
        this->match = false;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  if (this->match == false) {
    this->value = 0;
    std::__cxx11::string::_M_assign((string *)&this->name);
    this->expand = to - from == 1;
  }
  else {
    this->expand = false;
  }
  return;
}

Assistant:

Field::Field(int from, int to, std::string str)
    : from(from), to(to)
{
    value = 0;
    match = true;
    
    for(char c : str)
    {
        if(c == '1')
            value = 2 * value + 1;
        else if(c == '0')
            value = 2 * value;
        else
            match = false;
    }
    if(!match)
    {
        value = 0;
        name = str;
        expand = (to - from == 1);
    }
    else
        expand = false;
}